

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::MarkConstantAddressSyms(Func *this,BVSparse<Memory::JitArenaAllocator> *bv)

{
  code *pcVar1;
  bool bVar2;
  Func *pFVar3;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  Func *this_local;
  
  pFVar3 = GetTopFunc(this);
  if (pFVar3 != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7e0,"(this->GetTopFunc() == this)","this->GetTopFunc() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  SListBase<IR::RegOpnd*,Memory::ArenaAllocator,RealCount>::
  Iterate<Func::MarkConstantAddressSyms(BVSparse<Memory::JitArenaAllocator>*)::__0>
            ((SListBase<IR::RegOpnd*,Memory::ArenaAllocator,RealCount> *)
             &this->constantAddressRegOpnd,(anon_class_8_1_3fcf6512)bv);
  return;
}

Assistant:

void Func::MarkConstantAddressSyms(BVSparse<JitArenaAllocator> * bv)
{
    Assert(this->GetTopFunc() == this);
    this->constantAddressRegOpnd.Iterate([bv](IR::RegOpnd * regOpnd)
    {
        bv->Set(regOpnd->m_sym->m_id);
    });
}